

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_analyze.hpp
# Opt level: O3

bool __thiscall duckdb::AlpAnalyzeState<float>::HasEnoughSpace(AlpAnalyzeState<float> *this)

{
  ushort uVar1;
  BlockManager *pBVar2;
  idx_t iVar3;
  uint64_t uVar4;
  idx_t iVar5;
  idx_t iVar6;
  
  pBVar2 = (this->super_AnalyzeState).info.block_manager;
  iVar3 = this->current_bytes_used_in_segment;
  uVar1 = (this->state).exceptions_count;
  uVar4 = (this->state).bp_size;
  iVar5 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
  iVar6 = optional_idx::GetIndex(&pBVar2->block_header_size);
  return (iVar3 + uVar4 + (ulong)uVar1 * 6 + 0x18 & 0xfffffffffffffff8) <= (iVar5 - iVar6) - 4;
}

Assistant:

idx_t RequiredSpace() const {
		idx_t required_space =
		    state.bp_size + state.exceptions_count * (sizeof(EXACT_TYPE) + AlpConstants::EXCEPTION_POSITION_SIZE) +
		    AlpConstants::EXPONENT_SIZE + AlpConstants::FACTOR_SIZE + AlpConstants::EXCEPTIONS_COUNT_SIZE +
		    AlpConstants::FOR_SIZE + AlpConstants::BIT_WIDTH_SIZE + AlpConstants::METADATA_POINTER_SIZE;
		return required_space;
	}